

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

bool Assimp::IFC::TryAddOpenings_Poly2Tri
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer paVar7;
  pointer pTVar8;
  element_type *peVar9;
  pointer pIVar10;
  pointer pvVar11;
  double *pdVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  pointer paVar16;
  pointer pEVar17;
  bool bVar18;
  aiMatrix3x3t<double> *paVar19;
  aiVector3t<double> *paVar20;
  ulong uVar21;
  CDT *this;
  long lVar22;
  IfcVector2 *pip;
  pointer paVar23;
  pointer pIVar24;
  long lVar25;
  Polygon *__range4;
  pointer pvVar26;
  IfcMatrix3 *pIVar27;
  Polygon *__range3;
  pointer pTVar28;
  pointer pEVar29;
  IfcVector3 *x;
  pointer paVar30;
  aiVector3t<double> *pVector;
  vector<p2t::Point*,std::allocator<p2t::Point*>> *this_00;
  long *plVar31;
  byte bVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  aiVector2t<double> aVar36;
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour;
  bool ok;
  Polygon hole;
  aiVector3t<double> res;
  double local_3d8;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [64];
  _Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_378;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_360;
  Polygons holes_union;
  undefined4 uStack_334;
  ExPolygons clipped;
  double local_2f8;
  undefined8 uStack_2e0;
  double local_2d8;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> contour_points;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  contours;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcMatrix3 m;
  IfcVector3 nor;
  IfcVector3 vv;
  
  bVar32 = 0;
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4fa626);
  nor.x = 0.0;
  nor.y = 0.0;
  nor.z = 0.0;
  DerivePlaneCoordinateSpace(&m,curmesh,&ok,&nor);
  if (ok == true) {
    pIVar27 = &m;
    paVar19 = (aiMatrix3x3t<double> *)&vv;
    for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
      paVar19->a1 = pIVar27->a1;
      pIVar27 = (IfcMatrix3 *)((long)pIVar27 + (ulong)bVar32 * -0x10 + 8);
      paVar19 = (aiMatrix3x3t<double> *)((long)paVar19 + (ulong)bVar32 * -0x10 + 8);
    }
    paVar19 = aiMatrix3x3t<double>::Inverse((aiMatrix3x3t<double> *)&vv);
    local_2d8 = paVar19->a1;
    dVar13 = paVar19->a2;
    dVar34 = paVar19->a3;
    uVar15 = paVar19->a3;
    dVar1 = paVar19->b1;
    dVar2 = paVar19->b2;
    dVar3 = paVar19->b3;
    dVar4 = paVar19->c1;
    dVar5 = paVar19->c2;
    dVar6 = paVar19->c3;
    contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (&contour_flat,
               ((long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(curmesh->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    paVar30 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar7 = (curmesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_3b8._8_8_ = 0xc202a05f20000000;
    local_3b8._0_8_ = 0xc202a05f20000000;
    local_3c8._8_8_ = 0x4202a05f20000000;
    local_3c8._0_8_ = 0x4202a05f20000000;
    local_3d8 = -1.0;
    for (; paVar30 != paVar7; paVar30 = paVar30 + 1) {
      ::operator*(&m,paVar30);
      dVar38 = vv.y;
      dVar33 = vv.x;
      local_3d8 = vv.z;
      contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)vv.x;
      contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)vv.y;
      std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
      emplace_back<aiVector2t<double>>
                ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&contour_flat,
                 (aiVector2t<double> *)&contour);
      auVar14._8_8_ = dVar38;
      auVar14._0_8_ = dVar33;
      local_3b8._0_16_ = maxpd(local_3b8._0_16_,auVar14);
      local_3c8 = minpd(local_3c8,auVar14);
    }
    local_3b8._0_8_ = (double)local_3b8._0_8_ - (double)local_3c8._0_8_;
    local_3b8._8_8_ = (double)local_3b8._8_8_ - (double)local_3c8._8_8_;
    dVar33 = SQRT((double)local_3b8._0_8_ * (double)local_3b8._0_8_ +
                  (double)local_3b8._8_8_ * (double)local_3b8._8_8_);
    if ((dVar33 == 0.0) && (!NAN(dVar33))) {
      __assert_fail("vmax.Length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x5dc,
                    "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                   );
    }
    clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    holes_union.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    holes_union.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    holes_union.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ClipperLib::Clipper::Clipper((Clipper *)&vv);
    pTVar8 = (openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar22 = 0;
    for (pTVar28 = (openings->
                   super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                   )._M_impl.super__Vector_impl_data._M_start; pTVar28 != pTVar8;
        pTVar28 = pTVar28 + 1) {
      paVar30 = (nors->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      if (0.9999989867210388 <=
          ABS(nor.z * paVar30[lVar22].z + nor.x * paVar30[lVar22].x + nor.y * paVar30[lVar22].y)) {
        peVar9 = (pTVar28->profileMesh).
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (2 < (ulong)(((long)(peVar9->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar9->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
          contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          paVar30 = (peVar9->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (pVector = (peVar9->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              paVar16 = contour.
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish, pVector != paVar30;
              pVector = pVector + 1) {
            ::operator*(&m,pVector);
            dVar33 = pVector->x + (pTVar28->extrusionDir).x;
            dVar41 = pVector->y + (pTVar28->extrusionDir).y;
            dVar38 = pVector->z + (pTVar28->extrusionDir).z;
            res.x = dVar38 * m.a3 + dVar33 * m.a1 + m.a2 * dVar41;
            res.y = dVar38 * m.b3 + dVar33 * m.b1 + m.b2 * dVar41;
            res.z = dVar38 * m.c3 + dVar33 * m.c1 + dVar41 * m.c2;
            paVar20 = (aiVector3t<double> *)&hole;
            if (ABS(res.z - local_3d8) <
                ABS((double)hole.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - local_3d8)) {
              paVar20 = &res;
            }
            local_378._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(((_Vector_impl *)&paVar20->x)->super__Vector_impl_data)._M_start;
            local_378._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar20->y;
            hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)local_378._M_impl.super__Vector_impl_data._M_start;
            hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)local_378._M_impl.super__Vector_impl_data._M_finish;
            hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar20->z;
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            emplace_back<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&contour,
                       (aiVector2t<double> *)&local_378);
          }
          hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          for (paVar23 = contour.
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; paVar23 != paVar16;
              paVar23 = paVar23 + 1) {
            auVar35._0_8_ = paVar23->x - (double)local_3c8._0_8_;
            auVar35._8_8_ = paVar23->y - (double)local_3c8._8_8_;
            aVar36 = (aiVector2t<double>)divpd(auVar35,local_3b8._0_16_);
            *paVar23 = aVar36;
            dVar33 = aVar36.x * 1518500249.0;
            uVar21 = (ulong)dVar33;
            res.x = (double)((long)(dVar33 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21)
            ;
            dVar33 = aVar36.y * 1518500249.0;
            uVar21 = (ulong)dVar33;
            res.y = (double)((long)(dVar33 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21)
            ;
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            emplace_back<ClipperLib::IntPoint>
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&hole,
                       (IntPoint *)&res);
          }
          bVar18 = ClipperLib::Orientation(&hole);
          if (!bVar18) {
            std::
            __reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                      (hole.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       hole.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)((long)&vv.x + *(long *)((long)vv.x + -0x18)),&hole,ptSubject);
          std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
          ~_Vector_base((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *
                        )&hole);
          std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
                    (&contour.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
        }
      }
      lVar22 = lVar22 + 1;
    }
    ClipperLib::Clipper::Execute((Clipper *)&vv,ctUnion,&holes_union,pftNonZero,pftNonZero);
    paVar16 = contour_flat.
              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (holes_union.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        holes_union.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ClipperLib::Clipper::~Clipper((Clipper *)&vv);
      bVar18 = false;
    }
    else {
      contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (paVar23 = contour_flat.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; paVar23 != paVar16;
          paVar23 = paVar23 + 1) {
        auVar37._0_8_ = paVar23->x - (double)local_3c8._0_8_;
        auVar37._8_8_ = paVar23->y - (double)local_3c8._8_8_;
        aVar36 = (aiVector2t<double>)divpd(auVar37,local_3b8._0_16_);
        *paVar23 = aVar36;
        dVar33 = aVar36.x * 1518500249.0;
        uVar21 = (ulong)dVar33;
        hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pointer)((long)(dVar33 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21);
        dVar33 = aVar36.y * 1518500249.0;
        uVar21 = (ulong)dVar33;
        hole.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
        .super__Vector_impl_data._M_finish =
             (pointer)((long)(dVar33 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        emplace_back<ClipperLib::IntPoint>
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&contour,
                   (IntPoint *)&hole);
      }
      bVar18 = ClipperLib::Orientation((Polygon *)&contour);
      if (bVar18) {
        std::
        __reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                  (contour.
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   contour.
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      ClipperLib::Clipper::Clear((Clipper *)&vv);
      ClipperLib::ClipperBase::AddPolygon
                ((ClipperBase *)
                 ((long)&((Clipper *)&vv)->_vptr_Clipper + *(long *)((long)vv.x + -0x18)),
                 (Polygon *)&contour,ptSubject);
      ClipperLib::ClipperBase::AddPolygons
                ((ClipperBase *)
                 ((long)&((Clipper *)&vv)->_vptr_Clipper + *(long *)((long)vv.x + -0x18)),
                 &holes_union,ptClip);
      ClipperLib::Clipper::Execute((Clipper *)&vv,ctDifference,&clipped,pftNonZero,pftNonZero);
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                ((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &contour);
      ClipperLib::Clipper::~Clipper((Clipper *)&vv);
      pEVar17 = clipped.
                super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_378._M_impl.super__Vector_impl_data._M_start =
           (curmesh->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_378._M_impl.super__Vector_impl_data._M_finish =
           (curmesh->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_378._M_impl.super__Vector_impl_data._M_end_of_storage =
           (curmesh->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288._M_impl.super__Vector_impl_data._M_start =
           (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_288._M_impl.super__Vector_impl_data._M_finish =
           (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_288._M_impl.super__Vector_impl_data._M_end_of_storage =
           (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      contours.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_360 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&curmesh->mVertcnt;
      contours.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      contours.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uStack_334 = (undefined4)((ulong)dVar2 >> 0x20);
      uStack_2e0 = (double)CONCAT44(uStack_334,SUB84(dVar34,0));
      local_2d8 = (double)((ulong)local_2d8 & 0xffffffff00000000);
      bVar18 = false;
      for (pEVar29 = clipped.
                     super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                     ._M_impl.super__Vector_impl_data._M_start; pEVar29 != pEVar17;
          pEVar29 = pEVar29 + 1) {
        std::
        vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
        ::clear(&contours);
        contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pIVar10 = (pEVar29->outer).
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pIVar24 = (pEVar29->outer).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start; pIVar24 != pIVar10;
            pIVar24 = pIVar24 + 1) {
          vv.x = (double)operator_new(0x28);
          auVar39._0_8_ = (double)pIVar24->X;
          auVar39._8_8_ = (double)pIVar24->Y;
          auVar40 = divpd(auVar39,_DAT_006309b0);
          *(undefined1 (*) [16])vv.x = auVar40;
          *(undefined8 *)*(undefined1 (*) [16])((long)vv.x + 0x10) = 0;
          *(undefined8 *)(*(undefined1 (*) [16])((long)vv.x + 0x10) + 8) = 0;
          *(undefined8 *)*(undefined1 (*) [16])((long)vv.x + 0x20) = 0;
          std::vector<p2t::Point*,std::allocator<p2t::Point*>>::emplace_back<p2t::Point*>
                    ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&contour_points,
                     (Point **)&vv);
        }
        this = (CDT *)operator_new(0x10);
        p2t::CDT::CDT(this,&contour_points);
        pvVar11 = (pEVar29->holes).
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar26 = (pEVar29->holes).
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pvVar26 != pvVar11;
            pvVar26 = pvVar26 + 1) {
          vv.x = 0.0;
          vv.y = 0.0;
          vv.z = 0.0;
          std::
          vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
          ::emplace_back<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>
                    ((vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
                      *)&contours,(vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&vv);
          std::_Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>::~_Vector_base
                    ((_Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&vv);
          this_00 = (vector<p2t::Point*,std::allocator<p2t::Point*>> *)
                    (contours.
                     super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
          pIVar10 = (pvVar26->
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar24 = (pvVar26->
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         )._M_impl.super__Vector_impl_data._M_start; pIVar24 != pIVar10;
              pIVar24 = pIVar24 + 1) {
            vv.x = (double)operator_new(0x28);
            auVar40._0_8_ = (double)pIVar24->X;
            auVar40._8_8_ = (double)pIVar24->Y;
            auVar40 = divpd(auVar40,_DAT_006309b0);
            *(undefined1 (*) [16])vv.x = auVar40;
            *(undefined8 *)*(undefined1 (*) [16])((long)vv.x + 0x10) = 0;
            *(undefined8 *)(*(undefined1 (*) [16])((long)vv.x + 0x10) + 8) = 0;
            *(undefined8 *)*(undefined1 (*) [16])((long)vv.x + 0x20) = 0;
            std::vector<p2t::Point*,std::allocator<p2t::Point*>>::emplace_back<p2t::Point*>
                      (this_00,(Point **)&vv);
          }
          p2t::CDT::AddHole(this,(vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)this_00);
        }
        p2t::CDT::Triangulate(this);
        p2t::CDT::GetTriangles
                  ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&vv,this);
        dVar2 = vv.y;
        for (plVar31 = (long *)vv.x; plVar31 != (long *)dVar2; plVar31 = plVar31 + 1) {
          lVar22 = *plVar31;
          for (lVar25 = 1; lVar25 != 4; lVar25 = lVar25 + 1) {
            pdVar12 = *(double **)(lVar22 + lVar25 * 8);
            dVar34 = *pdVar12;
            if ((((1.0 < dVar34) || (dVar34 < 0.0)) || (dVar33 = pdVar12[1], 1.0 < dVar33)) ||
               (dVar33 < 0.0)) {
              __assert_fail("v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x68a,
                            "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                           );
            }
            dVar34 = dVar34 * (double)local_3b8._0_8_ + (double)local_3c8._0_8_;
            dVar33 = dVar33 * (double)local_3b8._8_8_ + (double)local_3c8._8_8_;
            contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(dVar34 * local_2d8 + dVar33 * dVar13 + (double)uVar15 * local_3d8);
            contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(dVar34 * dVar1 + dVar33 * uStack_2e0 + dVar3 * local_3d8);
            contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(dVar4 * dVar34 + dVar5 * dVar33 + dVar6 * local_3d8);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,(value_type *)&contour);
          }
          contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(contour.
                                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_360,
                     (uint *)&contour);
        }
        std::_Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~_Vector_base
                  ((_Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&vv);
        bVar18 = true;
        std::_Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>::~_Vector_base
                  (&contour_points.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>);
      }
      if (!bVar18) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    )local_378._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    )local_378._M_impl.super__Vector_impl_data._M_finish);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  (local_360,
                   (const_iterator)
                   (curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_288._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_288._M_impl.super__Vector_impl_data._M_finish);
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4fb328);
      }
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::~vector(&contours);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_288);
      std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                (&local_378);
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&holes_union);
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&clipped);
    std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
              (&contour_flat.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
  }
  else {
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool TryAddOpenings_Poly2Tri(const std::vector<TempOpening>& openings,const std::vector<IfcVector3>& nors,
    TempMesh& curmesh)
{
    IFCImporter::LogWarn("forced to use poly2tri fallback method to generate wall openings");
    std::vector<IfcVector3>& out = curmesh.mVerts;

    bool result = false;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system.
    bool ok;
    IfcVector3 nor;
    const IfcMatrix3 m = DerivePlaneCoordinateSpace(curmesh, ok, nor);
    if (!ok) {
        return false;
    }

    const IfcMatrix3 minv = IfcMatrix3(m).Inverse();


    IfcFloat coord = -1;

    std::vector<IfcVector2> contour_flat;
    contour_flat.reserve(out.size());

    IfcVector2 vmin, vmax;
    MinMaxChooser<IfcVector2>()(vmin, vmax);

    // Move all points into the new coordinate system, collecting min/max verts on the way
    for(IfcVector3& x : out) {
        const IfcVector3 vv = m * x;

        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).


        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }

        coord = vv.z;

        vmin = std::min(IfcVector2(vv.x, vv.y), vmin);
        vmax = std::max(IfcVector2(vv.x, vv.y), vmax);

        contour_flat.push_back(IfcVector2(vv.x,vv.y));
    }

    // With the current code in DerivePlaneCoordinateSpace,
    // vmin,vmax should always be the 0...1 rectangle (+- numeric inaccuracies)
    // but here we won't rely on this.

    vmax -= vmin;

    // If this happens then the projection must have been wrong.
    ai_assert(vmax.Length());

    ClipperLib::ExPolygons clipped;
    ClipperLib::Polygons holes_union;


    IfcVector3 wall_extrusion;
    bool first = true;

    try {

        ClipperLib::Clipper clipper_holes;
        size_t c = 0;

        for(const TempOpening& t :openings) {
            const IfcVector3& outernor = nors[c++];
            const IfcFloat dot = nor * outernor;
            if (std::fabs(dot)<1.f-1e-6f) {
                continue;
            }

            const std::vector<IfcVector3>& va = t.profileMesh->mVerts;
            if(va.size() <= 2) {
                continue;
            }

            std::vector<IfcVector2> contour;

            for(const IfcVector3& xx : t.profileMesh->mVerts) {
                IfcVector3 vv = m *  xx, vv_extr = m * (xx + t.extrusionDir);

                const bool is_extruded_side = std::fabs(vv.z - coord) > std::fabs(vv_extr.z - coord);
                if (first) {
                    first = false;
                    if (dot > 0.f) {
                        wall_extrusion = t.extrusionDir;
                        if (is_extruded_side) {
                            wall_extrusion = - wall_extrusion;
                        }
                    }
                }

                // XXX should not be necessary - but it is. Why? For precision reasons?
                vv = is_extruded_side ? vv_extr : vv;
                contour.push_back(IfcVector2(vv.x,vv.y));
            }

            ClipperLib::Polygon hole;
            for(IfcVector2& pip : contour) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                hole.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            }

            if (!ClipperLib::Orientation(hole)) {
                std::reverse(hole.begin(), hole.end());
            //  assert(ClipperLib::Orientation(hole));
            }

            /*ClipperLib::Polygons pol_temp(1), pol_temp2(1);
            pol_temp[0] = hole;

            ClipperLib::OffsetPolygons(pol_temp,pol_temp2,5.0);
            hole = pol_temp2[0];*/

            clipper_holes.AddPolygon(hole,ClipperLib::ptSubject);
        }

        clipper_holes.Execute(ClipperLib::ctUnion,holes_union,
            ClipperLib::pftNonZero,
            ClipperLib::pftNonZero);

        if (holes_union.empty()) {
            return false;
        }

        // Now that we have the big union of all holes, subtract it from the outer contour
        // to obtain the final polygon to feed into the triangulator.
        {
            ClipperLib::Polygon poly;
            for(IfcVector2& pip : contour_flat) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                poly.push_back(ClipperLib::IntPoint( to_int64(pip.x), to_int64(pip.y) ));
            }

            if (ClipperLib::Orientation(poly)) {
                std::reverse(poly.begin(), poly.end());
            }
            clipper_holes.Clear();
            clipper_holes.AddPolygon(poly,ClipperLib::ptSubject);

            clipper_holes.AddPolygons(holes_union,ClipperLib::ptClip);
            clipper_holes.Execute(ClipperLib::ctDifference,clipped,
                ClipperLib::pftNonZero,
                ClipperLib::pftNonZero);
        }

    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, skipping openings for this face: (Clipper: "
            + std::string(sx) + ")");

        return false;
    }

    std::vector<IfcVector3> old_verts;
    std::vector<unsigned int> old_vertcnt;

    old_verts.swap(curmesh.mVerts);
    old_vertcnt.swap(curmesh.mVertcnt);

    std::vector< std::vector<p2t::Point*> > contours;
    for(ClipperLib::ExPolygon& clip : clipped) {

        contours.clear();

        // Build the outer polygon contour line for feeding into poly2tri
        std::vector<p2t::Point*> contour_points;
        for(ClipperLib::IntPoint& point : clip.outer) {
            contour_points.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
        }

        p2t::CDT* cdt ;
        try {
            // Note: this relies on custom modifications in poly2tri to raise runtime_error's
            // instead if assertions. These failures are not debug only, they can actually
            // happen in production use if the input data is broken. An assertion would be
            // inappropriate.
            cdt = new p2t::CDT(contour_points);
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }


        // Build the poly2tri inner contours for all holes we got from ClipperLib
        for(ClipperLib::Polygon& opening : clip.holes) {

            contours.push_back(std::vector<p2t::Point*>());
            std::vector<p2t::Point*>& contour = contours.back();

            for(ClipperLib::IntPoint& point : opening) {
                contour.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
            }

            cdt->AddHole(contour);
        }

        try {
            // Note: See above
            cdt->Triangulate();
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }

        const std::vector<p2t::Triangle*> tris = cdt->GetTriangles();

        // Collect the triangles we just produced
        for(p2t::Triangle* tri : tris) {
            for(int i = 0; i < 3; ++i) {

                const IfcVector2 v = IfcVector2(
                    static_cast<IfcFloat>( tri->GetPoint(i)->x ),
                    static_cast<IfcFloat>( tri->GetPoint(i)->y )
                );

                ai_assert(v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0);
                const IfcVector3 v3 = minv * IfcVector3(vmin.x + v.x * vmax.x, vmin.y + v.y * vmax.y,coord) ;

                curmesh.mVerts.push_back(v3);
            }
            curmesh.mVertcnt.push_back(3);
        }

        result = true;
    }

    if (!result) {
        // revert -- it's a shame, but better than nothing
        curmesh.mVerts.insert(curmesh.mVerts.end(),old_verts.begin(), old_verts.end());
        curmesh.mVertcnt.insert(curmesh.mVertcnt.end(),old_vertcnt.begin(), old_vertcnt.end());

        IFCImporter::LogError("Ifc: revert, could not generate openings for this wall");
    }

    return result;
}